

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  uint uVar1;
  int iVar2;
  int diff;
  nk_rune t;
  nk_rune f;
  nk_font_config *iter;
  nk_font_glyph *glyph;
  int total_glyphs;
  int count;
  int i;
  nk_rune unicode_local;
  nk_font *font_local;
  
  glyph._0_4_ = 0;
  if (font == (nk_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x32b9,
                  "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
  }
  if (font->glyphs != (nk_font_glyph *)0x0) {
    if ((font->info).ranges == (nk_rune *)0x0) {
      __assert_fail("font->info.ranges",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x32bb,
                    "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
    }
    if ((font == (nk_font *)0x0) || (font->glyphs == (nk_font_glyph *)0x0)) {
      font_local = (nk_font *)0x0;
    }
    else {
      font_local = (nk_font *)font->fallback;
      _t = font->config;
      do {
        iVar2 = nk_range_count(_t->range);
        for (total_glyphs = 0; total_glyphs < iVar2; total_glyphs = total_glyphs + 1) {
          uVar1 = _t->range[total_glyphs << 1];
          if ((uVar1 <= unicode) && (unicode <= _t->range[total_glyphs * 2 + 1])) {
            return font->glyphs + ((int)glyph + (unicode - uVar1));
          }
          glyph._0_4_ = (_t->range[total_glyphs * 2 + 1] - uVar1) + 1 + (int)glyph;
        }
        _t = _t->n;
      } while (_t != font->config);
    }
    return (nk_font_glyph *)font_local;
  }
  __assert_fail("font->glyphs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x32ba,"const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)")
  ;
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
    int i = 0;
    int count;
    int total_glyphs = 0;
    const struct nk_font_glyph *glyph = 0;
    const struct nk_font_config *iter = 0;

    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    NK_ASSERT(font->info.ranges);
    if (!font || !font->glyphs) return 0;

    glyph = font->fallback;
    iter = font->config;
    do {count = nk_range_count(iter->range);
        for (i = 0; i < count; ++i) {
            nk_rune f = iter->range[(i*2)+0];
            nk_rune t = iter->range[(i*2)+1];
            int diff = (int)((t - f) + 1);
            if (unicode >= f && unicode <= t)
                return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
            total_glyphs += diff;
        }
    } while ((iter = iter->n) != font->config);
    return glyph;
}